

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

void ZSTD_fillHashTableForCDict(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  uint uVar1;
  U32 *hashTable_00;
  BYTE *pBVar2;
  uint h;
  U32 index;
  BYTE *p_00;
  size_t hashAndTag_1;
  U32 p;
  size_t hashAndTag;
  U32 curr;
  U32 fastHashFillStep;
  BYTE *iend;
  BYTE *ip;
  BYTE *base;
  U32 mls;
  U32 hBits;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  void *end_local;
  ZSTD_matchState_t *ms_local;
  ulong local_28;
  size_t local_10;
  
  hashTable_00 = ms->hashTable;
  h = (ms->cParams).hashLog + 8;
  uVar1 = (ms->cParams).minMatch;
  pBVar2 = (ms->window).base;
  iend = pBVar2 + ms->nextToUpdate;
  if (dtlm != ZSTD_dtlm_full) {
    __assert_fail("dtlm == ZSTD_dtlm_full",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x1d,
                  "void ZSTD_fillHashTableForCDict(ZSTD_matchState_t *, const void *const, ZSTD_dictTableLoadMethod_e)"
                 );
  }
  while( true ) {
    if ((BYTE *)((long)end - 6U) <= iend + 3) {
      return;
    }
    index = (int)iend - (int)pBVar2;
    if (0x20 < h) break;
    switch(uVar1) {
    default:
      local_10 = ZSTD_hash4Ptr(iend,h);
      break;
    case 5:
      local_10 = ZSTD_hash5Ptr(iend,h);
      break;
    case 6:
      local_10 = ZSTD_hash6Ptr(iend,h);
      break;
    case 7:
      local_10 = ZSTD_hash7Ptr(iend,h);
      break;
    case 8:
      local_10 = ZSTD_hash8Ptr(iend,h);
    }
    ZSTD_writeTaggedIndex(hashTable_00,local_10,index);
    for (hashAndTag_1._4_4_ = 1; hashAndTag_1._4_4_ < 3; hashAndTag_1._4_4_ = hashAndTag_1._4_4_ + 1
        ) {
      p_00 = iend + hashAndTag_1._4_4_;
      if (0x20 < h) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      switch(uVar1) {
      default:
        local_28 = ZSTD_hash4Ptr(p_00,h);
        break;
      case 5:
        local_28 = ZSTD_hash5Ptr(p_00,h);
        break;
      case 6:
        local_28 = ZSTD_hash6Ptr(p_00,h);
        break;
      case 7:
        local_28 = ZSTD_hash7Ptr(p_00,h);
        break;
      case 8:
        local_28 = ZSTD_hash8Ptr(p_00,h);
      }
      if (hashTable_00[local_28 >> 8] == 0) {
        ZSTD_writeTaggedIndex(hashTable_00,local_28,index + hashAndTag_1._4_4_);
      }
    }
    iend = iend + 3;
  }
  __assert_fail("hBits <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
}

Assistant:

static void ZSTD_fillHashTableForCDict(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hBits = cParams->hashLog + ZSTD_SHORT_CACHE_TAG_BITS;
    U32  const mls = cParams->minMatch;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Currently, we always use ZSTD_dtlm_full for filling CDict tables.
     * Feel free to remove this assert if there's a good reason! */
    assert(dtlm == ZSTD_dtlm_full);

    /* Always insert every fastHashFillStep position into the hash table.
     * Insert the other positions if their hash entry is empty.
     */
    for ( ; ip + fastHashFillStep < iend + 2; ip += fastHashFillStep) {
        U32 const curr = (U32)(ip - base);
        {   size_t const hashAndTag = ZSTD_hashPtr(ip, hBits, mls);
            ZSTD_writeTaggedIndex(hashTable, hashAndTag, curr);   }

        if (dtlm == ZSTD_dtlm_fast) continue;
        /* Only load extra positions for ZSTD_dtlm_full */
        {   U32 p;
            for (p = 1; p < fastHashFillStep; ++p) {
                size_t const hashAndTag = ZSTD_hashPtr(ip + p, hBits, mls);
                if (hashTable[hashAndTag >> ZSTD_SHORT_CACHE_TAG_BITS] == 0) {  /* not yet filled */
                    ZSTD_writeTaggedIndex(hashTable, hashAndTag, curr + p);
                }   }   }   }
}